

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O3

TPZCompEl * TPZPostProcAnalysis::CreateTetraEl(TPZGeoEl *gel,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapeTetra> *this;
  
  if ((gel->fReference == (TPZCompEl *)0x0) && (gel->fNumInterfaces == 0)) {
    this = (TPZCompElH1<pzshape::TPZShapeTetra> *)operator_new(0xf0);
    *(undefined ***)
     &(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0197c9e0;
    TPZCompElH1<pzshape::TPZShapeTetra>::TPZCompElH1(this,&PTR_PTR_01972a50,mesh,gel,EH1Standard);
    *(undefined8 *)
     &this[1].super_TPZIntelGen<pzshape::TPZShapeTetra>.super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = 0;
    *(undefined ***)
     &(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01972680;
  }
  else {
    this = (TPZCompElH1<pzshape::TPZShapeTetra> *)0x0;
  }
  return (TPZCompEl *)this;
}

Assistant:

TPZCompEl *TPZPostProcAnalysis::CreateTetraEl(TPZGeoEl *gel,TPZCompMesh &mesh) {
	if(!gel->Reference() && gel->NumInterfaces() == 0)
		return new TPZCompElPostProc<TPZCompElH1<TPZShapeTetra> >(mesh,gel);
	return NULL;
}